

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTimeCode.cpp
# Opt level: O1

void __thiscall Imf_3_4::TimeCode::setBinaryGroup(TimeCode *this,int group,int value)

{
  ArgExc *this_00;
  byte bVar1;
  
  if (0xfffffff7 < group - 9U) {
    bVar1 = (char)(group << 2) - 4;
    this->_user = (value & 0xfU) << (bVar1 & 0x1f) | ~(0xf << (bVar1 & 0x1f)) & this->_user;
    return;
  }
  this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_3_4::ArgExc::ArgExc
            (this_00,
             "Cannot extract binary group from time code user data.  Group number is out of range.")
  ;
  __cxa_throw(this_00,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
}

Assistant:

void
TimeCode::setBinaryGroup (int group, int value)
{
    if (group < 1 || group > 8)
        throw IEX_NAMESPACE::ArgExc (
            "Cannot extract binary group from time code "
            "user data.  Group number is out of range.");

    int minBit = 4 * (group - 1);
    int maxBit = minBit + 3;
    setBitField (_user, minBit, maxBit, (unsigned int) value);
}